

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O2

void __thiscall HeapProfileTable::SaveProfile(HeapProfileTable *this,GenericWriter *writer)

{
  Bucket *b;
  HeapProfileBucket **ppHVar1;
  int i;
  long lVar2;
  
  tcmalloc::GenericWriter::AppendStr(writer,"heap profile: ");
  UnparseBucket(&this->total_,writer," heapprofile");
  for (lVar2 = 0; lVar2 != 179999; lVar2 = lVar2 + 1) {
    ppHVar1 = this->bucket_table_ + lVar2;
    while (b = *ppHVar1, b != (Bucket *)0x0) {
      UnparseBucket(b,writer,"");
      ppHVar1 = &b->next;
    }
  }
  tcmalloc::GenericWriter::AppendStr(writer,"\nMAPPED_LIBRARIES:\n");
  tcmalloc::SaveProcSelfMaps(writer);
  return;
}

Assistant:

void HeapProfileTable::SaveProfile(tcmalloc::GenericWriter* writer) const {
  writer->AppendStr(kProfileHeader);
  UnparseBucket(total_, writer, " heapprofile");

  int bucket_count = 0;
  for (int i = 0; i < kHashTableSize; i++) {
    for (Bucket* curr = bucket_table_[i]; curr != nullptr; curr = curr->next) {
      UnparseBucket(*curr, writer, "");
      bucket_count++;
    }
  }
  RAW_DCHECK(bucket_count == num_buckets_, "");
  (void)bucket_count;

  writer->AppendStr(kProcSelfMapsHeader);
  tcmalloc::SaveProcSelfMaps(writer);
}